

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall
dxil_spv::CFGNode::can_backtrace_to_with_blockers
          (CFGNode *this,CFGNode *parent,Vector<CFGNode_*> *block_nodes,
          UnorderedSet<const_CFGNode_*> *node_cache)

{
  pointer ppCVar1;
  bool bVar2;
  const_iterator cVar3;
  __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var4;
  __hashtable *__h;
  pointer ppCVar5;
  __node_gen_type __node_gen;
  CFGNode *local_40;
  CFGNode *local_38;
  
  local_40 = this;
  cVar3 = std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&node_cache->_M_h,&local_40);
  if (cVar3.super__Node_iterator_base<const_dxil_spv::CFGNode_*,_false>._M_cur == (__node_type *)0x0
     ) {
    local_40 = (CFGNode *)node_cache;
    local_38 = this;
    std::
    _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<dxil_spv::CFGNode_const*,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
              ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)node_cache,&local_38,&local_40);
    local_40 = this;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode_const*const>>
                      ((block_nodes->
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (block_nodes->
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish,&local_40);
    if (_Var4._M_current ==
        (block_nodes->
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      ppCVar5 = (this->pred).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (this->pred).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar5 != ppCVar1) {
        while( true ) {
          if (*ppCVar5 == parent) {
            return true;
          }
          bVar2 = can_backtrace_to_with_blockers(*ppCVar5,parent,block_nodes,node_cache);
          if (bVar2) break;
          ppCVar5 = ppCVar5 + 1;
          if (ppCVar5 == ppCVar1) {
            return false;
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CFGNode::can_backtrace_to_with_blockers(const CFGNode *parent, const Vector<CFGNode *> &block_nodes,
                                             UnorderedSet<const CFGNode *> &node_cache) const
{
	if (node_cache.count(this))
		return false;
	node_cache.insert(this);

	if (std::find(block_nodes.begin(), block_nodes.end(), this) != block_nodes.end())
		return false;

	for (auto *p : pred)
		if (p == parent || p->can_backtrace_to_with_blockers(parent, block_nodes, node_cache))
			return true;

	return false;
}